

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

void xmlSAX2UnparsedEntityDecl
               (void *ctx,xmlChar *name,xmlChar *publicId,xmlChar *systemId,xmlChar *notationName)

{
  xmlEntityPtr pxVar1;
  xmlChar *pxVar2;
  code *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  
  if (ctx == (void *)0x0) {
    return;
  }
  if (*(int *)((long)ctx + 0x150) == 2) {
    pxVar1 = xmlAddDtdEntity(*(xmlDocPtr *)((long)ctx + 0x10),name,3,publicId,systemId,notationName)
    ;
    if (pxVar1 != (xmlEntityPtr)0x0) goto LAB_0017bb85;
    if (((*(int *)((long)ctx + 0x1a4) != 0) && (*ctx != 0)) &&
       (pcVar3 = *(code **)(*ctx + 0xa8), pcVar3 != (code *)0x0)) {
      uVar5 = *(undefined8 *)((long)ctx + 8);
      pcVar4 = "Entity(%s) already defined in the external subset\n";
      goto LAB_0017bb79;
    }
  }
  else {
    if (*(int *)((long)ctx + 0x150) != 1) {
      xmlFatalErrMsg((xmlParserCtxtPtr)ctx,XML_ERR_INTERNAL_ERROR,
                     "SAX.xmlSAX2UnparsedEntityDecl(%s) called while not in subset\n",name,
                     notationName);
      return;
    }
    pxVar1 = xmlAddDocEntity(*(xmlDocPtr *)((long)ctx + 0x10),name,3,publicId,systemId,notationName)
    ;
    if (pxVar1 != (xmlEntityPtr)0x0) goto LAB_0017bb85;
    if (((*(int *)((long)ctx + 0x1a4) != 0) && (*ctx != 0)) &&
       (pcVar3 = *(code **)(*ctx + 0xa8), pcVar3 != (code *)0x0)) {
      uVar5 = *(undefined8 *)((long)ctx + 8);
      pcVar4 = "Entity(%s) already defined in the internal subset\n";
LAB_0017bb79:
      (*pcVar3)(uVar5,pcVar4,name);
    }
  }
  if (pxVar1 == (xmlEntityPtr)0x0) {
    return;
  }
LAB_0017bb85:
  if ((systemId != (xmlChar *)0x0) && (pxVar1->URI == (xmlChar *)0x0)) {
    if (*(long *)((long)ctx + 0x38) == 0) {
      pxVar2 = (xmlChar *)0x0;
    }
    else {
      pxVar2 = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 8);
    }
    if (pxVar2 == (xmlChar *)0x0) {
      pxVar2 = *(xmlChar **)((long)ctx + 0x118);
    }
    pxVar2 = xmlBuildURI(systemId,pxVar2);
    pxVar1->URI = pxVar2;
  }
  return;
}

Assistant:

void
xmlSAX2UnparsedEntityDecl(void *ctx, const xmlChar *name,
		   const xmlChar *publicId, const xmlChar *systemId,
		   const xmlChar *notationName)
{
    xmlEntityPtr ent;
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    if (ctx == NULL) return;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2UnparsedEntityDecl(%s, %s, %s, %s)\n",
            name, publicId, systemId, notationName);
#endif
    if (ctxt->inSubset == 1) {
	ent = xmlAddDocEntity(ctxt->myDoc, name,
			XML_EXTERNAL_GENERAL_UNPARSED_ENTITY,
			publicId, systemId, notationName);
	if ((ent == NULL) && (ctxt->pedantic) &&
	    (ctxt->sax != NULL) && (ctxt->sax->warning != NULL))
	    ctxt->sax->warning(ctxt->userData,
	     "Entity(%s) already defined in the internal subset\n", name);
	if ((ent != NULL) && (ent->URI == NULL) && (systemId != NULL)) {
	    xmlChar *URI;
	    const char *base = NULL;

	    if (ctxt->input != NULL)
		base = ctxt->input->filename;
	    if (base == NULL)
		base = ctxt->directory;

	    URI = xmlBuildURI(systemId, (const xmlChar *) base);
	    ent->URI = URI;
	}
    } else if (ctxt->inSubset == 2) {
	ent = xmlAddDtdEntity(ctxt->myDoc, name,
			XML_EXTERNAL_GENERAL_UNPARSED_ENTITY,
			publicId, systemId, notationName);
	if ((ent == NULL) && (ctxt->pedantic) &&
	    (ctxt->sax != NULL) && (ctxt->sax->warning != NULL))
	    ctxt->sax->warning(ctxt->userData,
	     "Entity(%s) already defined in the external subset\n", name);
	if ((ent != NULL) && (ent->URI == NULL) && (systemId != NULL)) {
	    xmlChar *URI;
	    const char *base = NULL;

	    if (ctxt->input != NULL)
		base = ctxt->input->filename;
	    if (base == NULL)
		base = ctxt->directory;

	    URI = xmlBuildURI(systemId, (const xmlChar *) base);
	    ent->URI = URI;
	}
    } else {
        xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
	     "SAX.xmlSAX2UnparsedEntityDecl(%s) called while not in subset\n",
	               name, NULL);
    }
}